

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

uint32_t helper_fmovemd_st_predec_m68k(CPUM68KState_conflict *env,uint32_t addr,uint32_t mask)

{
  float64 val;
  long lVar1;
  floatx80 a;
  uintptr_t unaff_retaddr;
  
  lVar1 = 0xe8;
  do {
    if ((char)mask < '\0') {
      a._8_4_ = *(undefined4 *)((long)env->dregs + lVar1);
      a.low = *(undefined8 *)((long)env->dregs + lVar1 + -8);
      a._12_4_ = 0;
      val = floatx80_to_float64_m68k(a,&env->fp_status);
      cpu_stq_data_ra_m68k(env,addr,val,unaff_retaddr);
      addr = addr - 8;
    }
    mask = mask * 2;
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != 0x68);
  return addr;
}

Assistant:

uint32_t HELPER(fmovemd_st_predec)(CPUM68KState *env, uint32_t addr,
                                   uint32_t mask)
{
    return fmovem_predec(env, addr, mask, cpu_st_float64_ra);
}